

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaBuild(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Gia_Man_t *pNew,Vec_Int_t *vMap,
                 Vec_Int_t *vPiMap)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_44;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPiMap_local;
  Vec_Int_t *vMap_local;
  Gia_Man_t *pNew_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCos_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar4 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,local_44);
      _iLit = Gia_ManObj(p,iVar1);
      bVar4 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsCo(_iLit);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                    ,0x106,
                    "void Bmc_MnaBuild(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pGVar3 = Gia_ObjFanin0(_iLit);
    Bmc_MnaBuild_rec(p,pGVar3,pNew,vMap,vPiMap);
    iVar1 = Gia_ObjFaninId0p(p,_iLit);
    iVar1 = Vec_IntEntry(vMap,iVar1);
    iVar2 = Gia_ObjFaninC0(_iLit);
    iVar1 = Abc_LitNotCond(iVar1,iVar2);
    iVar2 = Gia_ObjId(p,_iLit);
    Vec_IntWriteEntry(vMap,iVar2,iVar1);
    local_44 = local_44 + 1;
  }
  pGVar3 = Gia_ManConst0(p);
  *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0x7fffffffffffffff;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar4 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_44);
      _iLit = Gia_ManObj(p,iVar1);
      bVar4 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)_iLit = *(ulong *)_iLit & 0x7fffffffffffffff;
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void Bmc_MnaBuild( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        iLit = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), iLit );
    }
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}